

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMatrix4x4.cpp
# Opt level: O0

void __thiscall
utMatrix4x4_badIndexOperatorTest_Test::TestBody(utMatrix4x4_badIndexOperatorTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80 [3];
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ai_real *a0;
  aiMatrix4x4 m;
  utMatrix4x4_badIndexOperatorTest_Test *this_local;
  
  m._56_8_ = this;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&a0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       aiMatrix4x4t<float>::operator[]((aiMatrix4x4t<float> *)&a0,4);
  testing::internal::EqHelper<true>::Compare<float>
            ((EqHelper<true> *)local_68,"__null","a0",(Secret *)0x0,(float *)gtest_ar.message_.ptr_)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMatrix4x4.cpp"
               ,0x37,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST_F( utMatrix4x4, badIndexOperatorTest ) {
    aiMatrix4x4 m;
    ai_real *a0 = m[ 4 ];
    EXPECT_EQ( NULL, a0 );
}